

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Tag::add_simple_tag(Tag *this,char *tag_name,char *tag_string)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  SimpleTag *in_RDI;
  SimpleTag *st;
  char *in_stack_ffffffffffffffc8;
  bool local_1;
  
  bVar3 = ExpandSimpleTagsArray((Tag *)tag_string);
  if (bVar3) {
    pcVar2 = in_RDI->tag_name_;
    iVar1 = *(int *)((long)&in_RDI->tag_string_ + 4);
    *(int *)((long)&in_RDI->tag_string_ + 4) = iVar1 + 1;
    SimpleTag::Init((SimpleTag *)(pcVar2 + (long)iVar1 * 0x10));
    bVar3 = SimpleTag::set_tag_name(in_RDI,in_stack_ffffffffffffffc8);
    if (bVar3) {
      bVar3 = SimpleTag::set_tag_string(in_RDI,in_stack_ffffffffffffffc8);
      if (bVar3) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Tag::add_simple_tag(const char* tag_name, const char* tag_string) {
  if (!ExpandSimpleTagsArray())
    return false;

  SimpleTag& st = simple_tags_[simple_tags_count_++];
  st.Init();

  if (!st.set_tag_name(tag_name))
    return false;

  if (!st.set_tag_string(tag_string))
    return false;

  return true;
}